

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::brokerRegistration(CoreBroker *this,ActionMessage *command)

{
  ushort uVar1;
  BrokerState BVar2;
  uint uVar3;
  GlobalFederateId GVar4;
  int iVar5;
  byte *pbVar6;
  pointer pBVar7;
  pointer pcVar8;
  size_type sVar9;
  string_view message;
  bool bVar10;
  route_id rVar11;
  iterator iVar12;
  string *psVar13;
  mapped_type *pmVar14;
  pointer pBVar15;
  int32_t errorCode;
  long lVar16;
  uint uVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  optional<unsigned_long> oVar18;
  string_view name;
  string_view fmt;
  format_args args;
  route_id route;
  GlobalBrokerId global_brkid;
  ActionMessage brokerReply;
  uint local_158;
  BaseType local_154;
  undefined1 local_150 [16];
  GlobalFederateId local_140;
  ushort local_136;
  SmallBuffer local_110;
  string local_98;
  size_t local_78;
  char *pcStack_70;
  byte *local_68;
  size_t local_60;
  BaseType local_58;
  uint local_48;
  
  if ((this->super_BrokerBase).field_0x295 == '\0') {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&this->earlyMessages,command);
    return;
  }
  uVar1 = command->flags;
  if (command->counter != 0) {
    local_150._0_8_ = (command->payload).bufferSize;
    local_150._8_8_ = (command->payload).heap;
    iVar12 = std::
             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&(this->mBrokers).lookup1,(key_type *)local_150);
    if (iVar12.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      pBVar15 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pBVar15 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start +
                *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x18);
    }
    if (pBVar15 !=
        (this->mBrokers).dataStorage.
        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      uVar3 = this->routeCount;
      this->routeCount = uVar3 + 1;
      uVar17 = uVar3 + 0xa000000;
      if ((uVar1 & 0x40) == 0) {
        uVar17 = uVar3;
      }
      (pBVar15->route).rid = uVar17;
      uVar3 = (command->dest_handle).hid;
      psVar13 = ActionMessage::getString_abi_cxx11_(command,0);
      (*(this->super_Broker)._vptr_Broker[0x24])
                (this,(ulong)uVar17,(ulong)uVar3,psVar13->_M_string_length,
                 (psVar13->_M_dataplus)._M_p);
      local_150._0_4_ = (pBVar15->global_id).gid;
      pmVar14 = CLI::std::__detail::
                _Map_base<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<helics::GlobalFederateId,_std::pair<const_helics::GlobalFederateId,_helics::route_id>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalFederateId>,_std::hash<helics::GlobalFederateId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->routing_table,(key_type *)local_150);
      pmVar14->rid = (pBVar15->route).rid;
      ActionMessage::ActionMessage((ActionMessage *)local_150,cmd_broker_ack);
      local_150._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      local_140.gid = (pBVar15->global_id).gid;
      local_110.bufferSize = (command->payload).bufferSize;
      pbVar6 = (command->payload).heap;
      if ((local_110.heap != pbVar6) &&
         (SmallBuffer::reserve(&local_110,local_110.bufferSize), local_110.bufferSize != 0)) {
        memcpy(local_110.heap,pbVar6,local_110.bufferSize);
      }
      if ((this->super_BrokerBase).no_ping == true) {
        local_136 = local_136 | 0x4000;
      }
      if ((((this->super_BrokerBase).globalTime != false) ||
          (uVar1 = local_136, (this->super_BrokerBase).asyncTime == true)) &&
         (uVar1 = local_136 | 0x20, (this->super_BrokerBase).asyncTime == true)) {
        uVar1 = local_136 | 0xa0;
      }
      local_136 = uVar1;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)(pBVar15->route).rid,local_150);
      goto LAB_00348988;
    }
  }
  if ((this->super_BrokerBase).maxBrokerCount <=
      (int)((ulong)((long)(this->mBrokers).dataStorage.
                          super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mBrokers).dataStorage.
                         super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x45d1745d) {
    errorCode = 0xd;
    goto LAB_00348ac8;
  }
  BVar2 = (this->super_BrokerBase).brokerState._M_i;
  if (BVar2 < OPERATING) {
    bVar10 = allInitReady(this);
    if (bVar10) {
      ActionMessage::ActionMessage((ActionMessage *)local_150,cmd_init_not_ready);
      local_150._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,(ActionMessage *)local_150);
      ActionMessage::~ActionMessage((ActionMessage *)local_150);
    }
  }
  else {
    if (BVar2 != OPERATING) {
      errorCode = 0xe;
      goto LAB_00348ac8;
    }
    if (((command->flags & 0x100) == 0) && ((this->super_BrokerBase).dynamicFederation == false)) {
      errorCode = 5;
      goto LAB_00348ac8;
    }
  }
  bVar10 = verifyBrokerKey(this,command);
  if (!bVar10) {
    errorCode = 9;
LAB_00348ac8:
    sendBrokerErrorAck(this,command,errorCode);
    return;
  }
  if ((command->flags & 0x2000) == 0) {
    local_150._0_8_ = (command->payload).bufferSize;
    local_150._8_8_ = (command->payload).heap;
    oVar18 = gmlc::containers::
             DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
             ::insert<std::basic_string_view<char,std::char_traits<char>>>
                       ((DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
                         *)&this->mBrokers);
    if (((undefined1  [16])
         oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      errorCode = 7;
      goto LAB_00348ac8;
    }
    GVar4.gid = (command->source_id).gid;
    if (((GVar4.gid == -2010000000) || (GVar4.gid == 0)) || (GVar4.gid == -1700000000)) {
      uVar3 = this->routeCount;
      uVar17 = uVar3 + 0xa000000;
      if ((uVar1 & 0x40) == 0) {
        uVar17 = uVar3;
      }
      this->routeCount = uVar3 + 1;
      (this->mBrokers).dataStorage.
      super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].route.rid = uVar17;
      uVar3 = (command->dest_handle).hid;
      psVar13 = ActionMessage::getString_abi_cxx11_(command,0);
      (*(this->super_Broker)._vptr_Broker[0x24])
                (this,(ulong)uVar17,(ulong)uVar3,psVar13->_M_string_length,
                 (psVar13->_M_dataplus)._M_p);
      pBVar15 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pBVar15[-1].parent.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pBVar15[-1]._nonLocal = false;
      pBVar15[-1]._route_key = true;
    }
    else {
      rVar11 = getRoute(this,GVar4);
      (this->mBrokers).dataStorage.
      super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].route.rid = rVar11.rid;
      if (rVar11.rid == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," invalid route to parent broker or reg broker\n",0x2e);
      }
      pBVar15 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pBVar15[-1].parent.gid = (command->source_id).gid;
      pBVar15[-1]._nonLocal = true;
    }
    uVar1 = command->flags;
    pBVar15[-1]._observer = (bool)((byte)(uVar1 >> 8) & 1);
    pBVar15 = (this->mBrokers).dataStorage.
              super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pBVar15[-1]._core = (bool)((byte)(uVar1 >> 3) & 1);
    if ((this->super_BrokerBase).field_0x294 == '\0') {
      iVar5 = (this->super_BrokerBase).global_broker_id_local.gid;
      if (((iVar5 != -2010000000) && (iVar5 != -1700000000)) && (iVar5 != 0)) {
        (command->source_id).gid = iVar5;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
        return;
      }
      gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::push<helics::ActionMessage&>
                ((SimpleQueue<helics::ActionMessage,std::mutex> *)&this->delayTransmitQueue,command)
      ;
      return;
    }
    pBVar7 = (this->mBrokers).dataStorage.
             super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar16 = ((long)pBVar15 - (long)pBVar7 >> 3) * 0x2e8ba2e8ba2e8ba3;
    local_150._0_8_ = lVar16 - 1;
    pBVar15[-1].global_id.gid = (int)lVar16 + 0x6fffffff;
    if (pBVar15 != pBVar7) {
      std::
      _Hashtable<helics::GlobalBrokerId,std::pair<helics::GlobalBrokerId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalBrokerId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalBrokerId>,std::hash<helics::GlobalBrokerId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<helics::GlobalBrokerId_const&,unsigned_long&>
                ((_Hashtable<helics::GlobalBrokerId,std::pair<helics::GlobalBrokerId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalBrokerId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalBrokerId>,std::hash<helics::GlobalBrokerId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&(this->mBrokers).lookup2,&pBVar15[-1].global_id,local_150);
    }
    pBVar15 = (this->mBrokers).dataStorage.
              super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_154 = pBVar15[-1].global_id.gid;
    local_158 = pBVar15[-1].route.rid;
    if ((command->flags & 0x4000) != 0) {
      pBVar15[-1]._disable_ping = true;
    }
    std::
    _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<helics::GlobalBrokerId&,helics::route_id&>
              ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->routing_table,&local_154,&local_158);
    ActionMessage::ActionMessage((ActionMessage *)local_150,cmd_broker_ack);
    local_150._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
    local_140.gid = local_154;
    local_110.bufferSize = (command->payload).bufferSize;
    pbVar6 = (command->payload).heap;
    if ((local_110.heap != pbVar6) &&
       (SmallBuffer::reserve(&local_110,local_110.bufferSize), local_110.bufferSize != 0)) {
      memcpy(local_110.heap,pbVar6,local_110.bufferSize);
    }
    if ((this->super_BrokerBase).no_ping == true) {
      local_136 = local_136 | 0x4000;
    }
    if ((((this->super_BrokerBase).globalTime != false) ||
        (uVar1 = local_136, (this->super_BrokerBase).asyncTime == true)) &&
       (uVar1 = local_136 | 0x20, (this->super_BrokerBase).asyncTime == true)) {
      uVar1 = local_136 | 0xa0;
    }
    local_136 = uVar1;
    if ((this->super_BrokerBase).globalDisconnect == true) {
      local_136 = local_136 | 0x800;
    }
    (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)local_158,local_150);
    if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
      GVar4.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pcVar8 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar9 = (this->super_BrokerBase).identifier._M_string_length;
      local_60 = (command->payload).bufferSize;
      local_68 = (command->payload).heap;
      local_58 = local_154;
      local_48 = local_158;
      fmt.size_ = 0x11d;
      fmt.data_ = (char *)0x25;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_98,(v11 *)"registering broker {}({}) on route {}",fmt,args);
      local_78 = local_98._M_string_length;
      pcStack_70 = local_98._M_dataplus._M_p;
      message._M_str = local_98._M_dataplus._M_p;
      message._M_len = local_98._M_string_length;
      name._M_str = pcVar8;
      name._M_len = sVar9;
      BrokerBase::sendToLogger(&this->super_BrokerBase,GVar4,9,name,message,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    GVar4.gid = (command->source_id).gid;
    if (((GVar4.gid == -2010000000) || (GVar4.gid == 0)) || (GVar4.gid == -1700000000)) {
      uVar3 = this->routeCount;
      this->routeCount = uVar3 + 1;
      rVar11.rid = uVar3 + 0xa000000;
      if ((uVar1 & 0x40) == 0) {
        rVar11.rid = uVar3;
      }
      uVar3 = (command->dest_handle).hid;
      psVar13 = ActionMessage::getString_abi_cxx11_(command,0);
      (*(this->super_Broker)._vptr_Broker[0x24])
                (this,(ulong)(uint)rVar11.rid,(ulong)uVar3,psVar13->_M_string_length,
                 (psVar13->_M_dataplus)._M_p);
      bVar10 = true;
    }
    else {
      rVar11 = getRoute(this,GVar4);
      bVar10 = false;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_150,cmd_broker_ack);
    local_136 = local_136 | 0x2010;
    local_150._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
    local_110.bufferSize = (command->payload).bufferSize;
    pbVar6 = (command->payload).heap;
    if ((local_110.heap != pbVar6) &&
       (SmallBuffer::reserve(&local_110,local_110.bufferSize), local_110.bufferSize != 0)) {
      memcpy(local_110.heap,pbVar6,local_110.bufferSize);
    }
    local_150._4_4_ = 0x133;
    (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar11.rid);
    if (bVar10) {
      (*(this->super_Broker)._vptr_Broker[0x25])(this,(ulong)(uint)rVar11.rid);
    }
  }
LAB_00348988:
  ActionMessage::~ActionMessage((ActionMessage *)local_150);
  return;
}

Assistant:

void CoreBroker::brokerRegistration(ActionMessage&& command)
{
    if (!connectionEstablished) {
        earlyMessages.push_back(std::move(command));
        return;
    }
    const bool jsonReply = checkActionFlag(command, use_json_serialization_flag);
    if (command.counter > 0) {  // this indicates it is a resend
        auto brk = mBrokers.find(command.name());
        if (brk != mBrokers.end()) {
            // we would get this if the ack didn't go through for some reason
            brk->route = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
            addRoute(brk->route, command.getExtraData(), command.getString(targetStringLoc));
            routing_table[brk->global_id] = brk->route;

            // sending the response message
            ActionMessage brokerReply(CMD_BROKER_ACK);
            brokerReply.source_id = global_broker_id_local;  // source is global root
            brokerReply.dest_id = brk->global_id;  // the new id
            brokerReply.name(command.name());  // the identifier of the broker
            if (no_ping) {
                setActionFlag(brokerReply, slow_responding_flag);
            }
            if (globalTime || asyncTime) {
                setActionFlag(brokerReply, global_timing_flag);
                if (asyncTime) {
                    setActionFlag(brokerReply, async_timing_flag);
                }
            }
            transmit(brk->route, brokerReply);
            return;
        }
    }
    // check the max broker count
    if (static_cast<decltype(maxBrokerCount)>(mBrokers.size()) >= maxBrokerCount) {
        sendBrokerErrorAck(command, max_broker_count_exceeded);
        return;
    }

    auto currentBrokerState = getBrokerState();
    if (currentBrokerState < BrokerState::OPERATING) {
        if (allInitReady()) {
            // send an init not ready as we were ready now we are not
            ActionMessage noInit(CMD_INIT_NOT_READY);
            noInit.source_id = global_broker_id_local;
            transmit(parent_route_id, noInit);
        }
    } else if (currentBrokerState == BrokerState::OPERATING) {
        // we are initialized already
        if (!checkActionFlag(command, observer_flag) && !dynamicFederation) {
            sendBrokerErrorAck(command, already_init_error_code);
            return;
        }
        // can't add a non observer federate in OPERATING mode unless this is a dynamicFederation
    } else {
        sendBrokerErrorAck(command, broker_terminating);
        return;
    }
    if (!verifyBrokerKey(command)) {
        sendBrokerErrorAck(command, mismatch_broker_key_error_code);
        return;
    }
    if (checkActionFlag(command, test_connection_flag)) {
        route_id newroute;
        bool route_created = false;
        if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
            newroute = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
            addRoute(newroute, command.getExtraData(), command.getString(targetStringLoc));
            route_created = true;
        } else {
            newroute = getRoute(command.source_id);
        }
        ActionMessage testInit(CMD_BROKER_ACK);
        setActionFlag(testInit, error_flag);
        setActionFlag(testInit, test_connection_flag);
        testInit.source_id = global_broker_id_local;
        testInit.name(command.name());
        testInit.messageID = CONNECTION_TEST;
        transmit(newroute, testInit);

        if (route_created) {
            removeRoute(newroute);
        }
        // this was a test connection and should not be added
        return;
    }
    auto inserted = mBrokers.insert(command.name(), no_search, command.name());
    if (!inserted) {
        sendBrokerErrorAck(command, duplicate_broker_name_error_code);
        return;
    }
    if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
        // TODO(PT): this will need to be updated when we enable mesh routing
        mBrokers.back().route = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
        addRoute(mBrokers.back().route, command.getExtraData(), command.getString(targetStringLoc));
        mBrokers.back().parent = global_broker_id_local;
        mBrokers.back()._nonLocal = false;
        mBrokers.back()._route_key = true;
        mBrokers.back()._observer = checkActionFlag(command, observer_flag);
    } else {
        mBrokers.back().route = getRoute(command.source_id);
        if (mBrokers.back().route == parent_route_id) {
            std::cout << " invalid route to parent broker or reg broker\n";
        }
        mBrokers.back().parent = command.source_id;
        mBrokers.back()._nonLocal = true;
        mBrokers.back()._observer = checkActionFlag(command, observer_flag);
    }
    mBrokers.back()._core = checkActionFlag(command, core_flag);
    if (!isRootc) {
        if ((global_broker_id_local.isValid()) && (global_broker_id_local != parent_broker_id)) {
            command.source_id = global_broker_id_local;
            transmit(parent_route_id, command);
        } else {
            // delay the response if we are not fully registered yet
            delayTransmitQueue.push(command);
        }
    } else {
        mBrokers.back().global_id = GlobalBrokerId(
            static_cast<GlobalBrokerId::BaseType>(mBrokers.size()) - 1 + gGlobalBrokerIdShift);
        mBrokers.addSearchTermForIndex(mBrokers.back().global_id, mBrokers.size() - 1);
        auto global_brkid = mBrokers.back().global_id;
        auto route = mBrokers.back().route;
        if (checkActionFlag(command, slow_responding_flag)) {
            mBrokers.back()._disable_ping = true;
        }
        routing_table.emplace(global_brkid, route);

        // sending the response message
        ActionMessage brokerReply(CMD_BROKER_ACK);
        brokerReply.source_id = global_broker_id_local;  // source is global root
        brokerReply.dest_id = global_brkid;  // the new id
        brokerReply.name(command.name());  // the identifier of the broker
        if (no_ping) {
            setActionFlag(brokerReply, slow_responding_flag);
        }
        if (globalTime || asyncTime) {
            setActionFlag(brokerReply, global_timing_flag);
            if (asyncTime) {
                setActionFlag(brokerReply, async_timing_flag);
            }
        }
        if (globalDisconnect) {
            setActionFlag(brokerReply, global_disconnect_flag);
        }
        transmit(route, brokerReply);
        LOG_CONNECTIONS(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("registering broker {}({}) on route {}",
                                    command.name(),
                                    global_brkid.baseValue(),
                                    route.baseValue()));
    }
}